

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O3

void __thiscall
mp::SolverApp<TestSolver,_TestNLReader>::ReadNL
          (SolverApp<TestSolver,_TestNLReader> *this,int nl_reader_flags)

{
  TestSolver *s;
  StrictMockProblemBuilder *pSVar1;
  SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
  *pSVar2;
  StringRef SVar3;
  StrictMockProblemBuilder *this_00;
  SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
  *pSVar4;
  time_point start;
  time_point local_70;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  double local_48 [3];
  ArgList local_30;
  
  local_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  this_00 = (StrictMockProblemBuilder *)operator_new(0x1ca8);
  s = &this->solver_;
  StrictMockProblemBuilder::StrictMockProblemBuilder(this_00,s);
  pSVar1 = (this->builder_)._M_t.
           super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
           ._M_t.
           super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
           .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl;
  (this->builder_)._M_t.
  super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>.
  _M_t.
  super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
  .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl = this_00;
  if (pSVar1 != (StrictMockProblemBuilder *)0x0) {
    (**(code **)((long)(pSVar1->super_StrictMock<MockProblemBuilder>)._vptr_StrictMock + 8))();
  }
  pSVar4 = (SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
            *)operator_new(0x88);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  uStack_50 = 0;
  (pSVar4->super_NLProblemBuilder<StrictMockProblemBuilder>).builder_ =
       (this->builder_)._M_t.
       super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
       ._M_t.
       super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
       .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl;
  (pSVar4->super_NLProblemBuilder<StrictMockProblemBuilder>)._vptr_NLProblemBuilder =
       (_func_int **)&PTR__SolverNLHandlerImpl_002902d8;
  pSVar4->solver_ = s;
  pSVar4->num_options_ = 0;
  std::function<void_()>::function(&pSVar4->after_header_,(function<void_()> *)&local_68);
  pSVar2 = (this->handler_)._M_t.
           super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
           .
           super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_false>
           ._M_head_impl;
  (this->handler_)._M_t.
  super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
  .
  super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_false>
  ._M_head_impl = pSVar4;
  if (pSVar2 != (SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
                 *)0x0) {
    (**(code **)((long)(pSVar2->super_NLProblemBuilder<StrictMockProblemBuilder>).
                       _vptr_NLProblemBuilder + 8))();
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  SVar3.data_ = (this->nl_filename)._M_dataplus._M_p;
  SVar3.size_ = (this->nl_filename)._M_string_length;
  TestNLReader::
  Read<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>>
            ((TestNLReader *)this,SVar3,
             (this->handler_)._M_t.
             super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
             .
             super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_false>
             ._M_head_impl,nl_reader_flags);
  local_48[0] = GetTimeAndReset(&local_70);
  if ((this->solver_).super_Solver.super_BasicSolver.timing_ != 0) {
    local_30.field_1.values_ = (Value *)local_48;
    local_30.types_ = 8;
    BasicSolver::Print((BasicSolver *)s,(CStringRef)0x21a575,&local_30);
  }
  return;
}

Assistant:

void SolverApp<Solver, Reader>::ReadNL(int nl_reader_flags) {
  std::chrono::steady_clock::time_point start = std::chrono::steady_clock::now();

  builder_.reset(new ProblemBuilder(solver_));
  handler_.reset(new internal::SolverNLHandler<Solver>(*builder_, solver_));
  this->Read(nl_filename, *handler_, nl_reader_flags);

  double read_time = GetTimeAndReset(start);
  if (solver_.timing())
    solver_.Print("Input time = {:.6f}s\n", read_time);
}